

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iter.c
# Opt level: O3

int32_t ecs_column_index_from_name(ecs_iter_t *it,char *name)

{
  int32_t iVar1;
  int iVar2;
  void *pvVar3;
  int index;
  
  if ((it->query != (ecs_query_t *)0x0) &&
     (iVar1 = ecs_vector_count((it->query->sig).columns), 0 < iVar1)) {
    index = 0;
    do {
      pvVar3 = _ecs_vector_get((it->query->sig).columns,0x28,0x10,index);
      if ((*(char **)((long)pvVar3 + 0x20) != (char *)0x0) &&
         (iVar2 = strcmp(name,*(char **)((long)pvVar3 + 0x20)), iVar2 == 0)) {
        return index + 1;
      }
      index = index + 1;
    } while (iVar1 != index);
  }
  return 0;
}

Assistant:

int32_t ecs_column_index_from_name(
    const ecs_iter_t *it,
    const char *name)
{
    ecs_sig_column_t *column = NULL;
    if (it->query) {
        int32_t i, count = ecs_vector_count(it->query->sig.columns);
        for (i = 0; i < count; i ++) {
            column = ecs_vector_get(
                it->query->sig.columns, ecs_sig_column_t, i);
            if (column->name) {
                if (!strcmp(name, column->name)) {
                    return i + 1;
                }
            }
        }
    }

    return 0;
}